

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

_Bool is_already_closed(Proc *proc,BasicBlock *block)

{
  Instruction *pIVar1;
  Instruction *last_insn;
  BasicBlock *block_local;
  Proc *proc_local;
  
  pIVar1 = raviX_last_instruction(block);
  if (pIVar1 == (Instruction *)0x0) {
    proc_local._7_1_ = false;
  }
  else if (*(char *)pIVar1 == '\x01') {
    proc_local._7_1_ = true;
  }
  else {
    proc_local._7_1_ = false;
  }
  return proc_local._7_1_;
}

Assistant:

static bool is_already_closed(Proc *proc, BasicBlock *block)
{
	Instruction *last_insn = raviX_last_instruction(block);
	if (last_insn == NULL)
		return false;
	if (last_insn->opcode == op_ret)
		return true;
	if (last_insn->opcode == op_close) {
		// hmmm
		//assert(false);
		// FIXME we can have a block ending in op_close if its the last block
		// and there is an implicit return; amybe an OPT pass can remove these?
	}
	return false;
}